

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationDifferentDimensions_Test::
ColMatrix_MatrixMultiplicationDifferentDimensions_Test
          (ColMatrix_MatrixMultiplicationDifferentDimensions_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001bf170;
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationDifferentDimensions) {
  const ColMatrix a(
      2, 4,
      {{{0, 2}, {1, -7}}, {{0, 3}, {1, 2}}, {{0, -1}, {1, 1}}, {{1, 10}}});
  const ColMatrix b(
      4, 2,
      {{{0, 3}, {1, 2}, {2, -1}, {3, 2}}, {{0, 4}, {1, 1}, {2, 2}, {3, 7}}});
  const ColMatrix res(2, 2, {{{0, 13}, {1, 2}}, {{0, 9}, {1, 46}}});
  EXPECT_EQ(res, a * b);
}